

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::skipWhiteSpace(Parser *this)

{
  int iVar1;
  TokenBuffer local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  while( true ) {
    TokenBuffer::currentToken
              ((TokenBuffer *)
               &local_60.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (*(int *)&local_60.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi[2]._vptr__Sp_counted_base == 1) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      return;
    }
    TokenBuffer::currentToken
              ((TokenBuffer *)
               &local_60.tokenList.
                super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                _M_impl._M_node._M_size);
    iVar1 = *(int *)(local_60.tokenList.
                     super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl._M_node._M_size + 0x20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.tokenizer);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    if (iVar1 != 4) break;
    TokenBuffer::nextToken(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_60.tokenList.
                       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                       ._M_impl._M_node.super__List_node_base + 8));
  }
  return;
}

Assistant:

void Parser::skipWhiteSpace() noexcept {
  while (
      this->tokenBuffer->currentToken()->tokenType != TokenType::EndOfFile
      && this->tokenBuffer->currentToken()->tokenType == TokenType::WhiteSpace) {
    this->tokenBuffer->nextToken();
  }
}